

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

void init_stones(void)

{
  uint uVar1;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 0x1a; lVar2 = lVar2 + 1) {
    used[lVar2] = false;
  }
  for (lVar2 = 0; lVar2 != 0xe; lVar2 = lVar2 + 1) {
    do {
      uVar1 = rnd(0x1a);
    } while (used[uVar1] != false);
    used[uVar1] = true;
    r_stones[lVar2] = stones[uVar1].st_name;
    ring_info[lVar2].oi_worth = ring_info[lVar2].oi_worth + stones[uVar1].st_value;
  }
  return;
}

Assistant:

void init_stones()
{
    unsigned int i, j;

    for (i = 0; i < NSTONES; i++)
        used[i] = false;
    for (i = 0; i < MAXRINGS; i++)
    {
        do
            j = rnd(NSTONES);
        until (!used[j]);
        used[j] = true;
        r_stones[i] = stones[j].st_name;
        ring_info[i].oi_worth += stones[j].st_value;
    }
}